

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSharedLibrary.cpp
# Opt level: O3

void __thiscall MinVR::VRSharedLibrary::unload(VRSharedLibrary *this)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  int local_f4;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->_isLoaded == true) {
    dlerror();
    iVar1 = dlclose(this->_lib);
    dlerror();
    if (iVar1 == 0) {
      this->_isLoaded = false;
    }
    else {
      std::operator+(&local_50,"Could not unload library: ",&this->_filePath);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_c0 = *plVar3;
        lStack_b8 = plVar2[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar3;
        local_d0 = (long *)*plVar2;
      }
      local_c8 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_f0.field_2._M_allocated_capacity = *psVar4;
        local_f0.field_2._8_4_ = (undefined4)plVar2[3];
        local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar4;
        local_f0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_f0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/plugin/VRSharedLibrary.cpp"
                 ,"");
      local_f4 = 0x87;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"void MinVR::VRSharedLibrary::unload()","");
      VRError::VRWarning(&local_f0,&local_70,&local_90,&local_f4,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void VRSharedLibrary::unload() {
	if (_isLoaded)
	{
		const char* error = "";
#if defined(WIN32)
		BOOL result = FreeLibrary(_lib);

		if (result != 0) {

			LPVOID lpMsgBuf;
			DWORD dw = GetLastError();

			FormatMessage(
				FORMAT_MESSAGE_ALLOCATE_BUFFER |
				FORMAT_MESSAGE_FROM_SYSTEM |
				FORMAT_MESSAGE_IGNORE_INSERTS,
				NULL,
				dw,
				MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
				(LPTSTR)&lpMsgBuf,
				0, NULL);

			error = static_cast<const char *>(lpMsgBuf);
		}
#else
		dlerror();
		int result = dlclose(_lib);
		error = dlerror();
#endif
		if(result != 0) {
      VRWARNINGNOADV("Could not unload library: " + _filePath + " - " + error);
			return;
		}

		_isLoaded = false;
	}
}